

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidget.cpp
# Opt level: O0

void QWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  int iVar2;
  WindowModality WVar3;
  LayoutDirection LVar4;
  InputMethodHints IVar5;
  QWindow *pQVar6;
  QRect *pQVar7;
  QPalette *pQVar8;
  QFont *pQVar9;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  qreal qVar10;
  void *_v_1;
  void *_v;
  QWindow *_r_1;
  bool _r;
  QWidget *_t;
  QPixmap _r_3;
  QPixmap _r_2;
  int in_stack_fffffffffffffd48;
  WindowModality in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  QWidget *in_stack_fffffffffffffd58;
  InputMethodQuery query;
  QWidget *in_stack_fffffffffffffd60;
  QWidget *in_stack_fffffffffffffd68;
  QSizePolicy policy;
  QWidget *in_stack_fffffffffffffd70;
  QWidget *in_stack_fffffffffffffd78;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 *in_stack_fffffffffffffd80;
  code *in_stack_fffffffffffffd88;
  QWidget *in_stack_fffffffffffffd90;
  code *in_stack_fffffffffffffd98;
  QWidget *in_stack_fffffffffffffda0;
  QWidget *pQVar11;
  QLocale local_1e0 [25];
  QIcon local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  QCursor local_e8;
  QSize local_dc;
  QSize local_d4;
  QSize local_cc;
  QSize local_c4;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_bc;
  QRegion local_b8;
  QRect local_b0;
  QRect local_a0;
  QSize local_90;
  QSize local_88;
  QPoint local_80;
  QRect local_78;
  QRect local_68;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_fffffffffffffd70 = (QWidget *)(ulong)in_EDX;
    query = (InputMethodQuery)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    bVar1 = SUB41(in_stack_fffffffffffffd4c >> 0x18,0);
    switch(in_stack_fffffffffffffd70) {
    case (QWidget *)0x0:
      windowTitleChanged((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0x1:
      windowIconChanged((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                        (QIcon *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0x2:
      windowIconTextChanged
                ((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0x3:
      customContextMenuRequested
                ((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                 (QPoint *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0x4:
      setEnabled(in_stack_fffffffffffffd60,SUB81((ulong)in_stack_fffffffffffffd58 >> 0x38,0));
      break;
    case (QWidget *)0x5:
      setDisabled((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),bVar1);
      break;
    case (QWidget *)0x6:
      setWindowModified(in_stack_fffffffffffffd68,SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0))
      ;
      break;
    case (QWidget *)0x7:
      setWindowTitle(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
      break;
    case (QWidget *)0x8:
      setStyleSheet(in_stack_fffffffffffffda0,(QString *)in_stack_fffffffffffffd98);
      break;
    case (QWidget *)0x9:
      setFocus((QWidget *)0x384384);
      break;
    case (QWidget *)0xa:
      update((QWidget *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0xb:
      repaint((QWidget *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0xc:
      (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,**(byte **)(in_RCX + 8) & 1);
      break;
    case (QWidget *)0xd:
      setHidden((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),bVar1);
      break;
    case (QWidget *)0xe:
      show(in_stack_fffffffffffffd60);
      break;
    case (QWidget *)0xf:
      hide((QWidget *)0x384418);
      break;
    case (QWidget *)0x10:
      showMinimized((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      break;
    case (QWidget *)0x11:
      showMaximized(in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x12:
      showFullScreen(in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x13:
      showNormal(in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x14:
      iVar2 = close(in_RDI,0);
      if (*(long *)in_RCX != 0) {
        **(byte **)in_RCX = (byte)iVar2 & 1;
      }
      break;
    case (QWidget *)0x15:
      raise(in_RDI,0);
      break;
    case (QWidget *)0x16:
      lower(in_stack_fffffffffffffd60);
      break;
    case (QWidget *)0x17:
      updateMicroFocus(in_stack_fffffffffffffd60,query);
      break;
    case (QWidget *)0x18:
      updateMicroFocus(in_stack_fffffffffffffd60,query);
      break;
    case (QWidget *)0x19:
      d_func((QWidget *)0x38450d);
      QWidgetPrivate::_q_showIfNotHidden
                ((QWidgetPrivate *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      break;
    case (QWidget *)0x1a:
      d_func((QWidget *)0x384527);
      pQVar6 = QWidgetPrivate::_q_closestWindowHandle((QWidgetPrivate *)0x38452f);
      if (*(long *)in_RCX != 0) {
        **(undefined8 **)in_RCX = pQVar6;
      }
      break;
    case (QWidget *)0x1b:
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      grab(in_stack_fffffffffffffd90,(QRect *)in_stack_fffffffffffffd88);
      if (*(long *)in_RCX != 0) {
        QPixmap::operator=((QPixmap *)in_stack_fffffffffffffd58,
                           (QPixmap *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
        ;
      }
      QPixmap::~QPixmap((QPixmap *)&local_20);
      break;
    case (QWidget *)0x1c:
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar11 = in_RDI;
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
      QRect::QRect((QRect *)in_stack_fffffffffffffd70,(QPoint *)in_RDI,
                   (QSize *)in_stack_fffffffffffffd60);
      grab(in_stack_fffffffffffffd90,(QRect *)in_stack_fffffffffffffd88);
      if (*(long *)in_RCX != 0) {
        QPixmap::operator=((QPixmap *)in_stack_fffffffffffffd58,
                           (QPixmap *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
        ;
      }
      QPixmap::~QPixmap((QPixmap *)&local_38);
      in_stack_fffffffffffffd68 = in_RDI;
      in_RDI = pQVar11;
    }
  }
  if (in_ESI == 5) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QWidget::*)(QString_const&)>
                      (in_RCX,(void **)windowTitleChanged,0,0);
    if ((bVar1) ||
       (bVar1 = QtMocHelpers::indexOfMethod<void(QWidget::*)(QIcon_const&)>
                          (in_RCX,(void **)windowIconChanged,0,1), bVar1)) goto LAB_00385633;
    in_stack_fffffffffffffd98 = windowIconTextChanged;
    in_stack_fffffffffffffda0 = (QWidget *)0x0;
    bVar1 = QtMocHelpers::indexOfMethod<void(QWidget::*)(QString_const&)>
                      (in_RCX,(void **)windowIconTextChanged,0,2);
    if (bVar1) goto LAB_00385633;
    in_stack_fffffffffffffd88 = customContextMenuRequested;
    bVar1 = QtMocHelpers::indexOfMethod<void(QWidget::*)(QPoint_const&)>
                      (in_RCX,(void **)customContextMenuRequested,0,3);
    if (bVar1) goto LAB_00385633;
  }
  if (in_ESI == 1) {
    in_stack_fffffffffffffd80 = *(anon_union_4_2_313b0b05_for_QSizePolicy_1 **)in_RCX;
    in_stack_fffffffffffffd60 = (QWidget *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffd60) {
    case (QWidget *)0x0:
      bVar1 = isModal(in_RDI);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x1:
      WVar3 = windowModality(in_RDI);
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x2:
      bVar1 = isEnabled((QWidget *)0x384842);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x3:
      pQVar7 = geometry(in_RDI);
      *(undefined8 *)in_stack_fffffffffffffd80 = *(undefined8 *)pQVar7;
      *(undefined8 *)(in_stack_fffffffffffffd80 + 2) = *(undefined8 *)&pQVar7->x2;
      break;
    case (QWidget *)0x4:
      local_68 = frameGeometry((QWidget *)in_stack_fffffffffffffd88);
      *(undefined8 *)in_stack_fffffffffffffd80 = local_68._0_8_;
      *(undefined8 *)(in_stack_fffffffffffffd80 + 2) = local_68._8_8_;
      break;
    case (QWidget *)0x5:
      local_78 = normalGeometry(in_stack_fffffffffffffd68);
      *(undefined8 *)in_stack_fffffffffffffd80 = local_78._0_8_;
      *(undefined8 *)(in_stack_fffffffffffffd80 + 2) = local_78._8_8_;
      break;
    case (QWidget *)0x6:
      WVar3 = x(in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x7:
      WVar3 = y(in_stack_fffffffffffffd60);
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x8:
      local_80 = pos(in_stack_fffffffffffffd58);
      *(QPoint *)in_stack_fffffffffffffd80 = local_80;
      break;
    case (QWidget *)0x9:
      local_88 = frameSize(in_stack_fffffffffffffd70);
      *(QSize *)in_stack_fffffffffffffd80 = local_88;
      break;
    case (QWidget *)0xa:
      local_90 = size((QWidget *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      *(QSize *)in_stack_fffffffffffffd80 = local_90;
      break;
    case (QWidget *)0xb:
      WVar3 = width((QWidget *)0x3849b8);
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0xc:
      WVar3 = height((QWidget *)0x3849d3);
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0xd:
      local_a0 = rect(in_stack_fffffffffffffd68);
      *(undefined8 *)in_stack_fffffffffffffd80 = local_a0._0_8_;
      *(undefined8 *)(in_stack_fffffffffffffd80 + 2) = local_a0._8_8_;
      break;
    case (QWidget *)0xe:
      local_b0 = childrenRect(in_stack_fffffffffffffd78);
      *(undefined8 *)in_stack_fffffffffffffd80 = local_b0._0_8_;
      *(undefined8 *)(in_stack_fffffffffffffd80 + 2) = local_b0._8_8_;
      break;
    case (QWidget *)0xf:
      childrenRegion(in_stack_fffffffffffffd70);
      QRegion::operator=((QRegion *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QRegion *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QRegion::~QRegion(&local_b8);
      break;
    case (QWidget *)0x10:
      local_bc.bits =
           (Bits)sizePolicy((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
                           );
      in_stack_fffffffffffffd80->bits = (Bits)local_bc;
      break;
    case (QWidget *)0x11:
      local_c4 = minimumSize(in_stack_fffffffffffffd60);
      *(QSize *)in_stack_fffffffffffffd80 = local_c4;
      break;
    case (QWidget *)0x12:
      local_cc = maximumSize(in_stack_fffffffffffffd60);
      *(QSize *)in_stack_fffffffffffffd80 = local_cc;
      break;
    case (QWidget *)0x13:
      WVar3 = minimumWidth((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
      ;
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x14:
      WVar3 = minimumHeight((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
                           );
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x15:
      WVar3 = maximumWidth((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
      ;
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x16:
      WVar3 = maximumHeight((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
                           );
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x17:
      local_d4 = sizeIncrement(in_stack_fffffffffffffd60);
      *(QSize *)in_stack_fffffffffffffd80 = local_d4;
      break;
    case (QWidget *)0x18:
      local_dc = baseSize(in_stack_fffffffffffffd60);
      *(QSize *)in_stack_fffffffffffffd80 = local_dc;
      break;
    case (QWidget *)0x19:
      pQVar8 = palette((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      QPalette::operator=((QPalette *)&in_stack_fffffffffffffd80->bits,(QPalette *)pQVar8);
      break;
    case (QWidget *)0x1a:
      pQVar9 = font(in_RDI);
      QFont::operator=((QFont *)&in_stack_fffffffffffffd80->bits,pQVar9);
      break;
    case (QWidget *)0x1b:
      cursor(in_stack_fffffffffffffd68);
      QCursor::operator=((QCursor *)in_stack_fffffffffffffd60,(QCursor *)in_stack_fffffffffffffd58);
      QCursor::~QCursor(&local_e8);
      break;
    case (QWidget *)0x1c:
      bVar1 = hasMouseTracking((QWidget *)0x384c55);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x1d:
      bVar1 = hasTabletTracking((QWidget *)0x384c73);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x1e:
      bVar1 = isActiveWindow((QWidget *)in_stack_fffffffffffffd98);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x1f:
      WVar3 = focusPolicy(in_RDI);
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x20:
      bVar1 = hasFocus(in_stack_fffffffffffffd68);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x21:
      WVar3 = contextMenuPolicy(in_RDI);
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x22:
      bVar1 = updatesEnabled((QWidget *)0x384d03);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x23:
      bVar1 = isVisible((QWidget *)0x384d21);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x24:
      bVar1 = isMinimized(in_RDI);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x25:
      bVar1 = isMaximized(in_RDI);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x26:
      bVar1 = isFullScreen(in_RDI);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x27:
      local_f0 = (**(code **)(*(long *)in_RDI + 0x70))();
      *(undefined8 *)in_stack_fffffffffffffd80 = local_f0;
      break;
    case (QWidget *)0x28:
      local_f8 = (**(code **)(*(long *)in_RDI + 0x78))();
      *(undefined8 *)in_stack_fffffffffffffd80 = local_f8;
      break;
    case (QWidget *)0x29:
      bVar1 = acceptDrops((QWidget *)0x384def);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x2a:
      windowTitle(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x384e34);
      break;
    case (QWidget *)0x2b:
      windowIcon(in_stack_fffffffffffffd68);
      QIcon::operator=((QIcon *)in_stack_fffffffffffffd60,(QIcon *)in_stack_fffffffffffffd58);
      QIcon::~QIcon(local_118);
      break;
    case (QWidget *)0x2c:
      windowIconText(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x384ea6);
      break;
    case (QWidget *)0x2d:
      qVar10 = windowOpacity(in_stack_fffffffffffffd60);
      *(qreal *)in_stack_fffffffffffffd80 = qVar10;
      break;
    case (QWidget *)0x2e:
      bVar1 = isWindowModified((QWidget *)0x384ed3);
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x2f:
      toolTip(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x384f18);
      break;
    case (QWidget *)0x30:
      WVar3 = toolTipDuration((QWidget *)
                              CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      in_stack_fffffffffffffd80->data = WVar3;
      break;
    case (QWidget *)0x31:
      statusTip(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x384f6c);
      break;
    case (QWidget *)0x32:
      whatsThis(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x384fa5);
      break;
    case (QWidget *)0x33:
      accessibleName(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x384fde);
      break;
    case (QWidget *)0x34:
      accessibleDescription(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x385017);
      break;
    case (QWidget *)0x35:
      accessibleIdentifier(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x385050);
      break;
    case (QWidget *)0x36:
      LVar4 = layoutDirection((QWidget *)0x385062);
      in_stack_fffffffffffffd80->data = LVar4;
      break;
    case (QWidget *)0x37:
      bVar1 = autoFillBackground((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      *(bool *)in_stack_fffffffffffffd80 = bVar1;
      break;
    case (QWidget *)0x38:
      styleSheet(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x3850c2);
      break;
    case (QWidget *)0x39:
      locale(in_stack_fffffffffffffd58);
      QLocale::operator=((QLocale *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QLocale *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QLocale::~QLocale(local_1e0);
      break;
    case (QWidget *)0x3a:
      windowFilePath(in_stack_fffffffffffffd58);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      QString::~QString((QString *)0x385131);
      break;
    case (QWidget *)0x3b:
      IVar5 = inputMethodHints((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      in_stack_fffffffffffffd80->bits =
           (Bits)IVar5.super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
                 super_QFlagsStorage<Qt::InputMethodHint>.i;
    }
  }
  if (in_ESI == 2) {
    pQVar11 = *(QWidget **)in_RCX;
    in_stack_fffffffffffffd58 = (QWidget *)(ulong)(in_EDX - 1);
    policy.field_0 = SUB84((ulong)in_stack_fffffffffffffd68 >> 0x20,0);
    bVar1 = SUB41(in_stack_fffffffffffffd4c >> 0x18,0);
    switch(in_stack_fffffffffffffd58) {
    case (QWidget *)0x0:
      setWindowModality((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                        in_stack_fffffffffffffd4c);
      break;
    case (QWidget *)0x1:
      setEnabled(in_stack_fffffffffffffd60,false);
      break;
    case (QWidget *)0x2:
      setGeometry((QWidget *)in_stack_fffffffffffffd88,(QRect *)&in_stack_fffffffffffffd80->bits);
      break;
    default:
      break;
    case (QWidget *)0x7:
      move((QWidget *)&in_stack_fffffffffffffd80->bits,(QPoint *)pQVar11);
      break;
    case (QWidget *)0x9:
      resize((QWidget *)in_stack_fffffffffffffd88,(QSize *)&in_stack_fffffffffffffd80->bits);
      break;
    case (QWidget *)0xf:
      setSizePolicy(in_stack_fffffffffffffd60,policy);
      break;
    case (QWidget *)0x10:
      setMinimumSize(in_stack_fffffffffffffd60,(QSize *)in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x11:
      setMaximumSize(in_stack_fffffffffffffd60,(QSize *)in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x12:
      setMinimumWidth(in_stack_fffffffffffffd70,(int)policy.field_0);
      break;
    case (QWidget *)0x13:
      setMinimumHeight(in_stack_fffffffffffffd60,0);
      break;
    case (QWidget *)0x14:
      setMaximumWidth(in_stack_fffffffffffffd70,(int)policy.field_0);
      break;
    case (QWidget *)0x15:
      setMaximumHeight(in_stack_fffffffffffffd60,0);
      break;
    case (QWidget *)0x16:
      setSizeIncrement(in_stack_fffffffffffffd60,(QSize *)in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x17:
      setBaseSize(in_stack_fffffffffffffd60,(QSize *)in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x18:
      setPalette(in_stack_fffffffffffffd68,(QPalette *)in_stack_fffffffffffffd60);
      break;
    case (QWidget *)0x19:
      setFont(pQVar11,(QFont *)in_stack_fffffffffffffd70);
      break;
    case (QWidget *)0x1a:
      setCursor(in_stack_fffffffffffffd68,(QCursor *)in_stack_fffffffffffffd60);
      break;
    case (QWidget *)0x1b:
      setMouseTracking((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                       bVar1);
      break;
    case (QWidget *)0x1c:
      setTabletTracking((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                        bVar1);
      break;
    case (QWidget *)0x1e:
      setFocusPolicy((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd4c);
      break;
    case (QWidget *)0x20:
      setContextMenuPolicy(in_RDI,*(ContextMenuPolicy *)pQVar11);
      break;
    case (QWidget *)0x21:
      setUpdatesEnabled(in_stack_fffffffffffffd60,false);
      break;
    case (QWidget *)0x22:
      (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,(byte)pQVar11->super_QObject & 1);
      break;
    case (QWidget *)0x28:
      setAcceptDrops((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),bVar1)
      ;
      break;
    case (QWidget *)0x29:
      setWindowTitle(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
      break;
    case (QWidget *)0x2a:
      setWindowIcon(in_stack_fffffffffffffd60,(QIcon *)in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x2b:
      setWindowIconText(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
      break;
    case (QWidget *)0x2c:
      setWindowOpacity((QWidget *)&in_stack_fffffffffffffd80->bits,(qreal)in_RDI);
      break;
    case (QWidget *)0x2d:
      setWindowModified(in_stack_fffffffffffffd68,SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0))
      ;
      break;
    case (QWidget *)0x2e:
      setToolTip(in_stack_fffffffffffffd68,(QString *)in_stack_fffffffffffffd60);
      break;
    case (QWidget *)0x2f:
      setToolTipDuration((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                         in_stack_fffffffffffffd4c);
      break;
    case (QWidget *)0x30:
      setStatusTip((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0x31:
      setWhatsThis((QWidget *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (QString *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      break;
    case (QWidget *)0x32:
      setAccessibleName(in_stack_fffffffffffffd58,
                        (QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      break;
    case (QWidget *)0x33:
      setAccessibleDescription
                (in_stack_fffffffffffffd58,
                 (QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      break;
    case (QWidget *)0x34:
      setAccessibleIdentifier
                (in_stack_fffffffffffffd58,
                 (QString *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      break;
    case (QWidget *)0x35:
      setLayoutDirection(in_stack_fffffffffffffd60,LeftToRight);
      break;
    case (QWidget *)0x36:
      setAutoFillBackground(in_stack_fffffffffffffd60,false);
      break;
    case (QWidget *)0x37:
      setStyleSheet(in_stack_fffffffffffffda0,(QString *)in_stack_fffffffffffffd98);
      break;
    case (QWidget *)0x38:
      setLocale(in_stack_fffffffffffffd60,(QLocale *)in_stack_fffffffffffffd58);
      break;
    case (QWidget *)0x39:
      setWindowFilePath(in_stack_fffffffffffffd70,(QString *)in_stack_fffffffffffffd68);
      break;
    case (QWidget *)0x3a:
      setInputMethodHints(in_stack_fffffffffffffd58,(InputMethodHints)policy.field_0);
    }
  }
  if (in_ESI == 3) {
    if (in_EDX == 0x1b) {
      unsetCursor(in_stack_fffffffffffffd58);
    }
    else if (in_EDX == 0x36) {
      unsetLayoutDirection((QWidget *)CONCAT44(0x36,in_stack_fffffffffffffd50));
    }
    else if (in_EDX == 0x39) {
      unsetLocale((QWidget *)CONCAT44(0x39,in_stack_fffffffffffffd50));
    }
  }
LAB_00385633:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowTitleChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->windowIconChanged((*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[1]))); break;
        case 2: _t->windowIconTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->customContextMenuRequested((*reinterpret_cast< std::add_pointer_t<QPoint>>(_a[1]))); break;
        case 4: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->setDisabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 6: _t->setWindowModified((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 7: _t->setWindowTitle((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->setStyleSheet((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFocus(); break;
        case 10: _t->update(); break;
        case 11: _t->repaint(); break;
        case 12: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 13: _t->setHidden((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 14: _t->show(); break;
        case 15: _t->hide(); break;
        case 16: _t->showMinimized(); break;
        case 17: _t->showMaximized(); break;
        case 18: _t->showFullScreen(); break;
        case 19: _t->showNormal(); break;
        case 20: { bool _r = _t->close();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: _t->raise(); break;
        case 22: _t->lower(); break;
        case 23: _t->updateMicroFocus((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1]))); break;
        case 24: _t->updateMicroFocus(); break;
        case 25: _t->d_func()->_q_showIfNotHidden(); break;
        case 26: { QWindow* _r = _t->d_func()->_q_closestWindowHandle();
            if (_a[0]) *reinterpret_cast< QWindow**>(_a[0]) = std::move(_r); }  break;
        case 27: { QPixmap _r = _t->grab((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        case 28: { QPixmap _r = _t->grab();
            if (_a[0]) *reinterpret_cast< QPixmap*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowTitleChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QIcon & )>(_a, &QWidget::windowIconChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QString & )>(_a, &QWidget::windowIconTextChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidget::*)(const QPoint & )>(_a, &QWidget::customContextMenuRequested, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        case 1: *reinterpret_cast<Qt::WindowModality*>(_v) = _t->windowModality(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        case 3: *reinterpret_cast<QRect*>(_v) = _t->geometry(); break;
        case 4: *reinterpret_cast<QRect*>(_v) = _t->frameGeometry(); break;
        case 5: *reinterpret_cast<QRect*>(_v) = _t->normalGeometry(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->x(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->y(); break;
        case 8: *reinterpret_cast<QPoint*>(_v) = _t->pos(); break;
        case 9: *reinterpret_cast<QSize*>(_v) = _t->frameSize(); break;
        case 10: *reinterpret_cast<QSize*>(_v) = _t->size(); break;
        case 11: *reinterpret_cast<int*>(_v) = _t->width(); break;
        case 12: *reinterpret_cast<int*>(_v) = _t->height(); break;
        case 13: *reinterpret_cast<QRect*>(_v) = _t->rect(); break;
        case 14: *reinterpret_cast<QRect*>(_v) = _t->childrenRect(); break;
        case 15: *reinterpret_cast<QRegion*>(_v) = _t->childrenRegion(); break;
        case 16: *reinterpret_cast<QSizePolicy*>(_v) = _t->sizePolicy(); break;
        case 17: *reinterpret_cast<QSize*>(_v) = _t->minimumSize(); break;
        case 18: *reinterpret_cast<QSize*>(_v) = _t->maximumSize(); break;
        case 19: *reinterpret_cast<int*>(_v) = _t->minimumWidth(); break;
        case 20: *reinterpret_cast<int*>(_v) = _t->minimumHeight(); break;
        case 21: *reinterpret_cast<int*>(_v) = _t->maximumWidth(); break;
        case 22: *reinterpret_cast<int*>(_v) = _t->maximumHeight(); break;
        case 23: *reinterpret_cast<QSize*>(_v) = _t->sizeIncrement(); break;
        case 24: *reinterpret_cast<QSize*>(_v) = _t->baseSize(); break;
        case 25: *reinterpret_cast<QPalette*>(_v) = _t->palette(); break;
        case 26: *reinterpret_cast<QFont*>(_v) = _t->font(); break;
        case 27: *reinterpret_cast<QCursor*>(_v) = _t->cursor(); break;
        case 28: *reinterpret_cast<bool*>(_v) = _t->hasMouseTracking(); break;
        case 29: *reinterpret_cast<bool*>(_v) = _t->hasTabletTracking(); break;
        case 30: *reinterpret_cast<bool*>(_v) = _t->isActiveWindow(); break;
        case 31: *reinterpret_cast<Qt::FocusPolicy*>(_v) = _t->focusPolicy(); break;
        case 32: *reinterpret_cast<bool*>(_v) = _t->hasFocus(); break;
        case 33: *reinterpret_cast<Qt::ContextMenuPolicy*>(_v) = _t->contextMenuPolicy(); break;
        case 34: *reinterpret_cast<bool*>(_v) = _t->updatesEnabled(); break;
        case 35: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        case 36: *reinterpret_cast<bool*>(_v) = _t->isMinimized(); break;
        case 37: *reinterpret_cast<bool*>(_v) = _t->isMaximized(); break;
        case 38: *reinterpret_cast<bool*>(_v) = _t->isFullScreen(); break;
        case 39: *reinterpret_cast<QSize*>(_v) = _t->sizeHint(); break;
        case 40: *reinterpret_cast<QSize*>(_v) = _t->minimumSizeHint(); break;
        case 41: *reinterpret_cast<bool*>(_v) = _t->acceptDrops(); break;
        case 42: *reinterpret_cast<QString*>(_v) = _t->windowTitle(); break;
        case 43: *reinterpret_cast<QIcon*>(_v) = _t->windowIcon(); break;
        case 44: *reinterpret_cast<QString*>(_v) = _t->windowIconText(); break;
        case 45: *reinterpret_cast<double*>(_v) = _t->windowOpacity(); break;
        case 46: *reinterpret_cast<bool*>(_v) = _t->isWindowModified(); break;
        case 47: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 48: *reinterpret_cast<int*>(_v) = _t->toolTipDuration(); break;
        case 49: *reinterpret_cast<QString*>(_v) = _t->statusTip(); break;
        case 50: *reinterpret_cast<QString*>(_v) = _t->whatsThis(); break;
        case 51: *reinterpret_cast<QString*>(_v) = _t->accessibleName(); break;
        case 52: *reinterpret_cast<QString*>(_v) = _t->accessibleDescription(); break;
        case 53: *reinterpret_cast<QString*>(_v) = _t->accessibleIdentifier(); break;
        case 54: *reinterpret_cast<Qt::LayoutDirection*>(_v) = _t->layoutDirection(); break;
        case 55: *reinterpret_cast<bool*>(_v) = _t->autoFillBackground(); break;
        case 56: *reinterpret_cast<QString*>(_v) = _t->styleSheet(); break;
        case 57: *reinterpret_cast<QLocale*>(_v) = _t->locale(); break;
        case 58: *reinterpret_cast<QString*>(_v) = _t->windowFilePath(); break;
        case 59: *reinterpret_cast<Qt::InputMethodHints*>(_v) = _t->inputMethodHints(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setWindowModality(*reinterpret_cast<Qt::WindowModality*>(_v)); break;
        case 2: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setGeometry(*reinterpret_cast<QRect*>(_v)); break;
        case 8: _t->move(*reinterpret_cast<QPoint*>(_v)); break;
        case 10: _t->resize(*reinterpret_cast<QSize*>(_v)); break;
        case 16: _t->setSizePolicy(*reinterpret_cast<QSizePolicy*>(_v)); break;
        case 17: _t->setMinimumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 18: _t->setMaximumSize(*reinterpret_cast<QSize*>(_v)); break;
        case 19: _t->setMinimumWidth(*reinterpret_cast<int*>(_v)); break;
        case 20: _t->setMinimumHeight(*reinterpret_cast<int*>(_v)); break;
        case 21: _t->setMaximumWidth(*reinterpret_cast<int*>(_v)); break;
        case 22: _t->setMaximumHeight(*reinterpret_cast<int*>(_v)); break;
        case 23: _t->setSizeIncrement(*reinterpret_cast<QSize*>(_v)); break;
        case 24: _t->setBaseSize(*reinterpret_cast<QSize*>(_v)); break;
        case 25: _t->setPalette(*reinterpret_cast<QPalette*>(_v)); break;
        case 26: _t->setFont(*reinterpret_cast<QFont*>(_v)); break;
        case 27: _t->setCursor(*reinterpret_cast<QCursor*>(_v)); break;
        case 28: _t->setMouseTracking(*reinterpret_cast<bool*>(_v)); break;
        case 29: _t->setTabletTracking(*reinterpret_cast<bool*>(_v)); break;
        case 31: _t->setFocusPolicy(*reinterpret_cast<Qt::FocusPolicy*>(_v)); break;
        case 33: _t->setContextMenuPolicy(*reinterpret_cast<Qt::ContextMenuPolicy*>(_v)); break;
        case 34: _t->setUpdatesEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 35: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        case 41: _t->setAcceptDrops(*reinterpret_cast<bool*>(_v)); break;
        case 42: _t->setWindowTitle(*reinterpret_cast<QString*>(_v)); break;
        case 43: _t->setWindowIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 44: _t->setWindowIconText(*reinterpret_cast<QString*>(_v)); break;
        case 45: _t->setWindowOpacity(*reinterpret_cast<double*>(_v)); break;
        case 46: _t->setWindowModified(*reinterpret_cast<bool*>(_v)); break;
        case 47: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 48: _t->setToolTipDuration(*reinterpret_cast<int*>(_v)); break;
        case 49: _t->setStatusTip(*reinterpret_cast<QString*>(_v)); break;
        case 50: _t->setWhatsThis(*reinterpret_cast<QString*>(_v)); break;
        case 51: _t->setAccessibleName(*reinterpret_cast<QString*>(_v)); break;
        case 52: _t->setAccessibleDescription(*reinterpret_cast<QString*>(_v)); break;
        case 53: _t->setAccessibleIdentifier(*reinterpret_cast<QString*>(_v)); break;
        case 54: _t->setLayoutDirection(*reinterpret_cast<Qt::LayoutDirection*>(_v)); break;
        case 55: _t->setAutoFillBackground(*reinterpret_cast<bool*>(_v)); break;
        case 56: _t->setStyleSheet(*reinterpret_cast<QString*>(_v)); break;
        case 57: _t->setLocale(*reinterpret_cast<QLocale*>(_v)); break;
        case 58: _t->setWindowFilePath(*reinterpret_cast<QString*>(_v)); break;
        case 59: _t->setInputMethodHints(*reinterpret_cast<Qt::InputMethodHints*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 27: _t->unsetCursor(); break;
        case 54: _t->unsetLayoutDirection(); break;
        case 57: _t->unsetLocale(); break;
        default: break;
        }
    }
}